

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

void get_txb_dimensions(MACROBLOCKD *xd,int plane,BLOCK_SIZE plane_bsize,int blk_row,int blk_col,
                       BLOCK_SIZE tx_bsize,int *width,int *height,int *visible_width,
                       int *visible_height)

{
  uint high;
  uint high_00;
  uint uVar1;
  int iVar2;
  long lVar3;
  int in_ECX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  byte in_R9B;
  int block_cols;
  int block_width;
  int block_rows;
  int block_height;
  macroblockd_plane *pd;
  uint *in_stack_00000020;
  int txb_width;
  int txb_height;
  
  high = (uint)block_size_high[in_R9B];
  high_00 = (uint)block_size_wide[in_R9B];
  lVar3 = in_RDI + 0x10 + (long)in_ESI * 0xa30;
  if (*(int *)(in_RDI + 0x1f00) < 0) {
    uVar1 = clamp((*(int *)(in_RDI + 0x1f00) >> ((char)*(undefined4 *)(lVar3 + 8) + 3U & 0x1f)) +
                  (uint)block_size_high[in_DL] + in_ECX * -4,0,high);
    *in_stack_00000020 = uVar1;
  }
  else {
    *in_stack_00000020 = high;
  }
  if (_block_rows != (uint *)0x0) {
    *_block_rows = high;
  }
  if (*(int *)(in_RDI + 0x1ef8) < 0) {
    iVar2 = clamp((*(int *)(in_RDI + 0x1ef8) >> ((char)*(undefined4 *)(lVar3 + 4) + 3U & 0x1f)) +
                  (uint)block_size_wide[in_DL] + in_R8D * -4,0,high_00);
    *(int *)pd = iVar2;
  }
  else {
    *(uint *)pd = high_00;
  }
  if (_block_cols != (uint *)0x0) {
    *_block_cols = high_00;
  }
  return;
}

Assistant:

static inline void get_txb_dimensions(const MACROBLOCKD *xd, int plane,
                                      BLOCK_SIZE plane_bsize, int blk_row,
                                      int blk_col, BLOCK_SIZE tx_bsize,
                                      int *width, int *height,
                                      int *visible_width, int *visible_height) {
  assert(tx_bsize <= plane_bsize);
  const int txb_height = block_size_high[tx_bsize];
  const int txb_width = block_size_wide[tx_bsize];
  const struct macroblockd_plane *const pd = &xd->plane[plane];

  // TODO(aconverse@google.com): Investigate using crop_width/height here rather
  // than the MI size
  if (xd->mb_to_bottom_edge >= 0) {
    *visible_height = txb_height;
  } else {
    const int block_height = block_size_high[plane_bsize];
    const int block_rows =
        (xd->mb_to_bottom_edge >> (3 + pd->subsampling_y)) + block_height;
    *visible_height =
        clamp(block_rows - (blk_row << MI_SIZE_LOG2), 0, txb_height);
  }
  if (height) *height = txb_height;

  if (xd->mb_to_right_edge >= 0) {
    *visible_width = txb_width;
  } else {
    const int block_width = block_size_wide[plane_bsize];
    const int block_cols =
        (xd->mb_to_right_edge >> (3 + pd->subsampling_x)) + block_width;
    *visible_width =
        clamp(block_cols - (blk_col << MI_SIZE_LOG2), 0, txb_width);
  }
  if (width) *width = txb_width;
}